

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_posix::time_put_posix<wchar_t>::do_put
          (time_put_posix<wchar_t> *this,iter_type out,ios_base *param_2,wchar_t param_3,tm *tm,
          char format,char modifier)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  streambuf_type *psVar6;
  undefined4 in_register_00000084;
  ulong uVar7;
  bool bVar8;
  iter_type iVar9;
  char_type_conflict fmt [4];
  wstring local_58;
  undefined4 local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  
  psVar6 = out._M_sbuf;
  uVar5 = out._8_4_;
  local_38 = 0x25;
  bVar8 = modifier == '\0';
  if (bVar8) {
    modifier = format;
  }
  local_34 = (int)modifier;
  if (bVar8) {
    format = '\0';
  }
  local_30 = (int)format;
  local_2c = 0;
  ftime_traits<wchar_t>::ftime_abi_cxx11_
            (&local_58,(ftime_traits<wchar_t> *)&local_38,&tm->tm_sec,
             (tm *)*(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(locale_t)CONCAT44(in_register_00000084,param_3));
  if (local_58._M_string_length != 0) {
    uVar3 = 0;
    uVar4 = local_58._M_string_length;
    uVar7 = 1;
    do {
      if ((uVar5 & 1) == 0) {
        wVar2 = local_58._M_dataplus._M_p[uVar3];
        pwVar1 = *(wchar_t **)(psVar6 + 0x28);
        if (pwVar1 < *(wchar_t **)(psVar6 + 0x30)) {
          *pwVar1 = wVar2;
          *(wchar_t **)(psVar6 + 0x28) = pwVar1 + 1;
        }
        else {
          wVar2 = (**(code **)(*(long *)psVar6 + 0x68))(psVar6,wVar2);
          uVar4 = local_58._M_string_length;
        }
        uVar5 = uVar5 & 0xff;
        if (wVar2 == L'\xffffffff') {
          uVar5 = 1;
        }
      }
      bVar8 = uVar7 < uVar4;
      uVar3 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  iVar9._8_4_ = uVar5;
  iVar9._M_sbuf = psVar6;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

virtual iter_type do_put(iter_type out,std::ios_base &/*ios*/,CharType /*fill*/,std::tm const *tm,char format,char modifier) const
    {
        char_type fmt[4] = { '%' , modifier != 0 ? modifier : format , modifier == 0 ? '\0' : format };
        string_type res = ftime_traits<char_type>::ftime(fmt,tm,*lc_);
        for(unsigned i=0;i<res.size();i++)
            *out++ = res[i];
        return out;
    }